

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Extractor::extract(Extractor *this,char *blob_name,Mat *feat,int type)

{
  NetPrivate *pNVar1;
  pointer ppcVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  
  iVar3 = Net::find_blob_index_by_name(this->d->net,blob_name);
  if (iVar3 != -1) {
    iVar3 = extract(this,iVar3,feat,type);
    return iVar3;
  }
  fwrite("Try",3,1,_stderr);
  fputc(10,_stderr);
  pNVar1 = this->d->net->d;
  for (uVar4 = 0;
      ppcVar2 = (pNVar1->output_blob_names).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(pNVar1->output_blob_names).
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3);
      uVar4 = uVar4 + 1) {
    fprintf(_stderr,"    ex.extract(\"%s\", out%d);",ppcVar2[uVar4],uVar4 & 0xffffffff);
    fputc(10,_stderr);
  }
  return -1;
}

Assistant:

int Extractor::extract(const char* blob_name, Mat& feat, int type)
{
    int blob_index = d->net->find_blob_index_by_name(blob_name);
    if (blob_index == -1)
    {
        NCNN_LOGE("Try");
        const std::vector<const char*>& output_names = d->net->output_names();
        for (size_t i = 0; i < output_names.size(); i++)
        {
            NCNN_LOGE("    ex.extract(\"%s\", out%d);", output_names[i], (int)i);
        }

        return -1;
    }

    return extract(blob_index, feat, type);
}